

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O2

int cuddInitInteract(DdManager *table)

{
  uint uVar1;
  uint uVar2;
  DdNode **ppDVar3;
  uint uVar4;
  long *__ptr;
  ulong uVar5;
  int *support;
  ulong uVar6;
  DdManager *pDVar7;
  ulong uVar9;
  DdNode *sentinel;
  long lVar10;
  DdManager *pDVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  DdNode *pDVar8;
  
  uVar1 = table->size;
  uVar9 = (ulong)(((int)((uVar1 - 1) * uVar1) >> 7) + 1);
  __ptr = (long *)malloc(uVar9 * 8);
  table->interact = __ptr;
  if (__ptr == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      __ptr[uVar5] = 0;
    }
    support = (int *)malloc((long)(int)uVar1 * 4);
    if (support != (int *)0x0) {
      uVar4 = uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        ppDVar3 = table->subtables[uVar9].nodelist;
        uVar2 = table->subtables[uVar9].slots;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
          pDVar7 = (DdManager *)ppDVar3[uVar5];
          while (pDVar7 != table) {
            pDVar8 = (pDVar7->sentinel).next;
            if (((ulong)pDVar8 & 1) == 0) {
              for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
                support[uVar6] = 0;
              }
              ddSuppInteract(&pDVar7->sentinel,support);
              ddClearLocal(&pDVar7->sentinel);
              uVar14 = table->size - 1;
              uVar6 = 0;
              if (0 < (int)uVar14) {
                uVar6 = (ulong)uVar14;
              }
              lVar10 = 1;
              for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
                lVar13 = lVar10;
                if (support[uVar12] == 1) {
                  for (; lVar13 - (ulong)uVar14 != 1; lVar13 = lVar13 + 1) {
                    if (support[lVar13] == 1) {
                      cuddSetInteract(table,(int)uVar12,(int)lVar13);
                    }
                  }
                }
                lVar10 = lVar10 + 1;
              }
              pDVar8 = (pDVar7->sentinel).next;
            }
            pDVar7 = (DdManager *)((ulong)pDVar8 & 0xfffffffffffffffe);
          }
        }
      }
      uVar9 = (ulong)(uint)table->size;
      if (table->size < 1) {
        uVar9 = 0;
      }
      for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
        ppDVar3 = table->subtables[uVar5].nodelist;
        uVar1 = table->subtables[uVar5].slots;
        uVar6 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar6 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
          pDVar7 = (DdManager *)ppDVar3[uVar12];
          while (pDVar7 != table) {
            pDVar11 = (DdManager *)((ulong)(pDVar7->sentinel).next & 0xfffffffffffffffe);
            (pDVar7->sentinel).next = (DdNode *)pDVar11;
            pDVar7 = pDVar11;
          }
        }
      }
      free(support);
      return 1;
    }
    table->errorCode = CUDD_MEMORY_OUT;
    free(__ptr);
  }
  return 0;
}

Assistant:

int
cuddInitInteract(
  DdManager * table)
{
    int i,j,k;
    ABC_UINT64_T words;
    long *interact;
    int *support;
    DdNode *f;
    DdNode *sentinel = &(table->sentinel);
    DdNodePtr *nodelist;
    int slots;
    int n = table->size;

    words = ((n * (n-1)) >> (1 + LOGBPL)) + 1;
    table->interact = interact = ABC_ALLOC(long,(unsigned)words);
    if (interact == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < words; i++) {
        interact[i] = 0;
    }

    support = ABC_ALLOC(int,n);
    if (support == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(interact);
        return(0);
    }

    for (i = 0; i < n; i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            f = nodelist[j];
            while (f != sentinel) {
                /* A node is a root of the DAG if it cannot be
                ** reached by nodes above it. If a node was never
                ** reached during the previous depth-first searches,
                ** then it is a root, and we start a new depth-first
                ** search from it.
                */
                if (!Cudd_IsComplement(f->next)) {
                    for (k = 0; k < n; k++) {
                        support[k] = 0;
                    }
                    ddSuppInteract(f,support);
                    ddClearLocal(f);
                    ddUpdateInteract(table,support);
                }
                f = Cudd_Regular(f->next);
            }
        }
    }
    ddClearGlobal(table);

    ABC_FREE(support);
    return(1);

}